

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O2

void __thiscall QHostInfoLookupManager::abortLookup(QHostInfoLookupManager *this,int id)

{
  long lVar1;
  bool bVar2;
  QHostInfoRunnable *pQVar3;
  QList<QHostInfoRunnable_*> *this_00;
  long i;
  long in_FS_OFFSET;
  int id_local;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &this->mutex;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  id_local = id;
  QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
  local_28[8] = true;
  if ((id == -1) || (this->wasDeleted != false)) goto LAB_001a2408;
  i = -1;
  do {
    if (i - (this->postponedLookups).d.size == -1) {
      i = -1;
      goto LAB_001a23ae;
    }
    lVar1 = i + 1;
    i = i + 1;
  } while ((this->postponedLookups).d.ptr[lVar1]->id != id);
  this_00 = &this->postponedLookups;
  goto LAB_001a23cc;
  while (lVar1 = i + 1, i = i + 1,
        (this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.ptr[lVar1]->id != id) {
LAB_001a23ae:
    if (i - (this->scheduledLookups).super_QList<QHostInfoRunnable_*>.d.size == -1) {
      bVar2 = QListSpecialMethodsBase<int>::contains<int>
                        ((QListSpecialMethodsBase<int> *)&this->abortedLookups,&id_local);
      if (!bVar2) {
        QList<int>::append(&this->abortedLookups,id_local);
      }
      goto LAB_001a2408;
    }
  }
  this_00 = &(this->scheduledLookups).super_QList<QHostInfoRunnable_*>;
LAB_001a23cc:
  pQVar3 = QList<QHostInfoRunnable_*>::takeAt(this_00,i);
  if (pQVar3 != (QHostInfoRunnable *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x10))(pQVar3);
  }
LAB_001a2408:
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHostInfoLookupManager::abortLookup(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return;

    if (id == -1)
        return;

#if QT_CONFIG(thread)
    // is postponed? delete and return
    for (int i = 0; i < postponedLookups.size(); i++) {
        if (postponedLookups.at(i)->id == id) {
            delete postponedLookups.takeAt(i);
            return;
        }
    }
#endif

    // is scheduled? delete and return
    for (int i = 0; i < scheduledLookups.size(); i++) {
        if (scheduledLookups.at(i)->id == id) {
            delete scheduledLookups.takeAt(i);
            return;
        }
    }

    if (!abortedLookups.contains(id))
        abortedLookups.append(id);
}